

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
::proxy_dispatcher_template_t
          (proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
           *this,disp_params_t *disp_params)

{
  undefined8 uVar1;
  
  so_5::dispatcher_t::dispatcher_t((dispatcher_t *)this);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__proxy_dispatcher_template_t_00287e68;
  (this->m_disp)._M_t.
  super___uniq_ptr_impl<so_5::disp::one_thread::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
  .super__Head_base<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_false>._M_head_impl =
       (actual_disp_iface_t *)0x0;
  (this->m_disp_params).
  super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::one_thread::disp_params_t>.m_flag =
       (disp_params->
       super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::one_thread::disp_params_t>).
       m_flag;
  *(undefined8 *)
   &(this->m_disp_params).m_queue_params.m_lock_factory.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->m_disp_params).m_queue_params.m_lock_factory.super__Function_base._M_functor + 8)
       = 0;
  (this->m_disp_params).m_queue_params.m_lock_factory.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->m_disp_params).m_queue_params.m_lock_factory._M_invoker =
       (disp_params->m_queue_params).m_lock_factory._M_invoker;
  if ((disp_params->m_queue_params).m_lock_factory.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)
             ((long)&(disp_params->m_queue_params).m_lock_factory.super__Function_base._M_functor +
             8);
    *(undefined8 *)
     &(this->m_disp_params).m_queue_params.m_lock_factory.super__Function_base._M_functor =
         *(undefined8 *)
          &(disp_params->m_queue_params).m_lock_factory.super__Function_base._M_functor;
    *(undefined8 *)
     ((long)&(this->m_disp_params).m_queue_params.m_lock_factory.super__Function_base._M_functor + 8
     ) = uVar1;
    (this->m_disp_params).m_queue_params.m_lock_factory.super__Function_base._M_manager =
         (disp_params->m_queue_params).m_lock_factory.super__Function_base._M_manager;
    (disp_params->m_queue_params).m_lock_factory.super__Function_base._M_manager =
         (_Manager_type)0x0;
    (disp_params->m_queue_params).m_lock_factory._M_invoker = (_Invoker_type)0x0;
  }
  (this->m_data_source_base_name)._M_dataplus._M_p =
       (pointer)&(this->m_data_source_base_name).field_2;
  (this->m_data_source_base_name)._M_string_length = 0;
  (this->m_data_source_base_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

proxy_dispatcher_template_t( DISP_PARAMS_TYPE disp_params )
			:	m_disp_params( std::move(disp_params) )
			{}